

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O1

path * __thiscall
ghc::filesystem::path::lexically_relative(path *__return_storage_ptr__,path *this,path *base)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  const_iterator cVar2;
  const_iterator cVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  size_type sVar7;
  path *element;
  format fVar8;
  bool bVar9;
  bool bVar10;
  iterator __begin2;
  iterator __end2;
  const_iterator a;
  const_iterator b;
  undefined1 local_2d8 [40];
  path local_2b0;
  undefined1 local_290 [32];
  const_iterator local_270;
  _Alloc_hider local_268;
  size_type local_260;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_258;
  undefined4 uStack_240;
  undefined4 uStack_23c;
  undefined4 local_238;
  undefined4 uStack_234;
  undefined4 uStack_230;
  undefined4 uStack_22c;
  const_iterator local_228;
  _Alloc_hider local_220;
  size_type local_218;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_210;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_200;
  long *local_1f8 [2];
  long local_1e8 [2];
  long *local_1d8 [2];
  long local_1c8 [2];
  const_iterator local_1b8;
  undefined4 uStack_1b0;
  undefined4 uStack_1ac;
  undefined4 local_1a8;
  undefined4 uStack_1a4;
  undefined4 uStack_1a0;
  undefined4 uStack_19c;
  char *local_198;
  long *local_190 [2];
  long local_180 [2];
  undefined1 local_170 [32];
  const_iterator local_150;
  path local_148;
  long *local_128 [2];
  long local_118 [2];
  iterator local_108;
  iterator local_c0;
  iterator local_78;
  
  root_name((path *)local_290,this);
  root_name((path *)local_170,base);
  iVar4 = compare((path *)local_290,(path *)local_170);
  if (iVar4 == 0) {
    sVar7 = root_name_length(this);
    if (sVar7 < (this->_path)._M_string_length) {
      bVar9 = (this->_path)._M_dataplus._M_p[sVar7] == '/';
    }
    else {
      bVar9 = false;
    }
    sVar7 = root_name_length(base);
    if (sVar7 < (base->_path)._M_string_length) {
      bVar10 = (base->_path)._M_dataplus._M_p[sVar7] == '/';
    }
    else {
      bVar10 = false;
    }
    if (bVar9 == bVar10) {
      sVar7 = root_name_length(this);
      if ((sVar7 < (this->_path)._M_string_length) && ((this->_path)._M_dataplus._M_p[sVar7] == '/')
         ) {
        if ((undefined1 *)local_170._0_8_ != local_170 + 0x10) {
          operator_delete((void *)local_170._0_8_,local_170._16_8_ + 1);
        }
        if ((undefined1 *)local_290._0_8_ != local_290 + 0x10) {
          operator_delete((void *)local_290._0_8_,CONCAT44(local_290._20_4_,local_290._16_4_) + 1);
        }
LAB_001d6c34:
        local_290._0_8_ = (this->_path)._M_dataplus._M_p;
        iterator::iterator((iterator *)local_170,this,(const_iterator *)local_290);
        local_290._0_8_ = (base->_path)._M_dataplus._M_p;
        iterator::iterator(&local_108,base,(const_iterator *)local_290);
        do {
          local_c0._first._M_current =
               (this->_path)._M_dataplus._M_p + (this->_path)._M_string_length;
          iterator::iterator((iterator *)local_290,this,&local_c0._first);
          cVar3._M_current = local_150._M_current;
          cVar2._M_current = local_270._M_current;
          if (local_150._M_current == local_270._M_current) {
LAB_001d6cfc:
            bVar9 = false;
          }
          else {
            local_c0._first._M_current =
                 (base->_path)._M_dataplus._M_p + (base->_path)._M_string_length;
            iterator::iterator(&local_78,base,&local_c0._first);
            if (local_108._iter._M_current == local_78._iter._M_current) goto LAB_001d6cfc;
            iVar4 = compare(&local_148,&local_108._current);
            bVar9 = iVar4 == 0;
          }
          if ((cVar3._M_current != cVar2._M_current) &&
             ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78._current._path._M_dataplus._M_p != &local_78._current._path.field_2)) {
            operator_delete(local_78._current._path._M_dataplus._M_p,
                            local_78._current._path.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_268._M_p != &local_258) {
            operator_delete(local_268._M_p,local_258._M_allocated_capacity + 1);
          }
          if (!bVar9) {
            local_c0._first._M_current =
                 (this->_path)._M_dataplus._M_p + (this->_path)._M_string_length;
            iterator::iterator((iterator *)local_290,this,&local_c0._first);
            if (local_150._M_current == local_270._M_current) {
              local_2d8._0_8_ = (base->_path)._M_dataplus._M_p + (base->_path)._M_string_length;
              iterator::iterator(&local_c0,base,(const_iterator *)local_2d8);
              bVar9 = local_108._iter._M_current == local_c0._iter._M_current;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_c0._current._path._M_dataplus._M_p != &local_c0._current._path.field_2) {
                operator_delete(local_c0._current._path._M_dataplus._M_p,
                                local_c0._current._path.field_2._M_allocated_capacity + 1);
              }
            }
            else {
              bVar9 = false;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_268._M_p != &local_258) {
              operator_delete(local_268._M_p,local_258._M_allocated_capacity + 1);
            }
            if (bVar9) {
              (__return_storage_ptr__->_path)._M_dataplus._M_p =
                   (pointer)&(__return_storage_ptr__->_path).field_2;
              fVar8 = 0x34d530;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)__return_storage_ptr__,".","");
              postprocess_path_with_format(__return_storage_ptr__,fVar8);
            }
            else {
              local_1b8._M_current = (base->_path)._M_dataplus._M_p + (base->_path)._M_string_length
              ;
              iterator::iterator((iterator *)local_2d8,base,&local_1b8);
              input_iterator_range<ghc::filesystem::path::iterator>::input_iterator_range
                        ((input_iterator_range<ghc::filesystem::path::iterator> *)local_290,
                         &local_108,(iterator *)local_2d8);
              paVar1 = &local_2b0._path.field_2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2b0._path._M_dataplus._M_p != paVar1) {
                operator_delete(local_2b0._path._M_dataplus._M_p,
                                local_2b0._path.field_2._M_allocated_capacity + 1);
              }
              local_2d8._32_8_ = local_270._M_current;
              local_2d8._16_4_ = local_290._16_4_;
              local_2d8._20_4_ = local_290._20_4_;
              local_2d8._24_4_ = local_290._24_4_;
              local_2d8._28_4_ = local_290._28_4_;
              local_2d8._0_8_ = local_290._0_8_;
              local_2d8._8_4_ = local_290._8_4_;
              local_2d8._12_4_ = local_290._12_4_;
              local_2b0._path._M_dataplus._M_p = (pointer)paVar1;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_2b0,local_268._M_p,local_268._M_p + local_260);
              local_198 = local_228._M_current;
              local_1a8 = local_238;
              uStack_1a4 = uStack_234;
              uStack_1a0 = uStack_230;
              uStack_19c = uStack_22c;
              uStack_1b0 = uStack_240;
              uStack_1ac = uStack_23c;
              local_190[0] = local_180;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_190,local_220._M_p,local_220._M_p + local_218);
              iVar4 = 0;
              while( true ) {
                if ((char *)local_2d8._32_8_ == local_198) break;
                fVar8 = 0x34d530;
                local_1f8[0] = local_1e8;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,".","");
                postprocess_path_with_format((path *)local_1f8,fVar8);
                iVar5 = compare(&local_2b0,(path *)local_1f8);
                if (iVar5 == 0) {
                  bVar9 = false;
                  bVar10 = false;
                }
                else {
                  local_1d8[0] = local_1c8;
                  fVar8 = 0x351b39;
                  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8);
                  postprocess_path_with_format((path *)local_1d8,fVar8);
                  iVar6 = compare(&local_2b0,(path *)local_1d8);
                  if (iVar6 == 0) {
                    bVar9 = false;
                    bVar10 = false;
                  }
                  else {
                    local_128[0] = local_118;
                    fVar8 = 0x26ea00;
                    std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"..","");
                    postprocess_path_with_format((path *)local_128,fVar8);
                    iVar6 = compare(&local_2b0,(path *)local_128);
                    bVar10 = iVar6 != 0;
                    bVar9 = true;
                  }
                }
                if ((bVar9) && (local_128[0] != local_118)) {
                  operator_delete(local_128[0],local_118[0] + 1);
                }
                if ((iVar5 != 0) && (local_1d8[0] != local_1c8)) {
                  operator_delete(local_1d8[0],local_1c8[0] + 1);
                }
                if (local_1f8[0] != local_1e8) {
                  operator_delete(local_1f8[0],local_1e8[0] + 1);
                }
                iVar5 = 1;
                if (!bVar10) {
                  fVar8 = 0x26ea00;
                  local_1f8[0] = local_1e8;
                  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"..","");
                  postprocess_path_with_format((path *)local_1f8,fVar8);
                  iVar5 = compare(&local_2b0,(path *)local_1f8);
                  if (local_1f8[0] != local_1e8) {
                    operator_delete(local_1f8[0],local_1e8[0] + 1);
                  }
                  iVar5 = -(uint)(iVar5 == 0);
                }
                iVar4 = iVar4 + iVar5;
                iterator::operator++((iterator *)local_2d8);
              }
              if (local_190[0] != local_180) {
                operator_delete(local_190[0],local_180[0] + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2b0._path._M_dataplus._M_p != &local_2b0._path.field_2) {
                operator_delete(local_2b0._path._M_dataplus._M_p,
                                local_2b0._path.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_220._M_p != &local_210) {
                operator_delete(local_220._M_p,local_210._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_268._M_p != &local_258) {
                operator_delete(local_268._M_p,local_258._M_allocated_capacity + 1);
              }
              paVar1 = &(__return_storage_ptr__->_path).field_2;
              (__return_storage_ptr__->_path)._M_dataplus._M_p = (pointer)paVar1;
              (__return_storage_ptr__->_path)._M_string_length = 0;
              (__return_storage_ptr__->_path).field_2._M_local_buf[0] = '\0';
              if (-1 < iVar4) {
                local_200 = paVar1;
                if (iVar4 != 0) {
                  do {
                    fVar8 = 0x26ea00;
                    local_290._0_8_ = local_290 + 0x10;
                    std::__cxx11::string::_M_construct<char_const*>((string *)local_290,"..","");
                    postprocess_path_with_format((path *)local_290,fVar8);
                    operator/=(__return_storage_ptr__,(path *)local_290);
                    if ((undefined1 *)local_290._0_8_ != local_290 + 0x10) {
                      operator_delete((void *)local_290._0_8_,
                                      CONCAT44(local_290._20_4_,local_290._16_4_) + 1);
                    }
                    iVar4 = iVar4 + -1;
                  } while (iVar4 != 0);
                }
                local_1b8._M_current =
                     (this->_path)._M_dataplus._M_p + (this->_path)._M_string_length;
                iterator::iterator((iterator *)local_2d8,this,&local_1b8);
                paVar1 = &local_2b0._path.field_2;
                input_iterator_range<ghc::filesystem::path::iterator>::input_iterator_range
                          ((input_iterator_range<ghc::filesystem::path::iterator> *)local_290,
                           (iterator *)local_170,(iterator *)local_2d8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_2b0._path._M_dataplus._M_p != paVar1) {
                  operator_delete(local_2b0._path._M_dataplus._M_p,
                                  local_2b0._path.field_2._M_allocated_capacity + 1);
                }
                local_2d8._32_8_ = local_270._M_current;
                local_2d8._16_4_ = local_290._16_4_;
                local_2d8._20_4_ = local_290._20_4_;
                local_2d8._24_4_ = local_290._24_4_;
                local_2d8._28_4_ = local_290._28_4_;
                local_2d8._0_8_ = local_290._0_8_;
                local_2d8._8_4_ = local_290._8_4_;
                local_2d8._12_4_ = local_290._12_4_;
                local_2b0._path._M_dataplus._M_p = (pointer)paVar1;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_2b0,local_268._M_p,local_268._M_p + local_260);
                local_198 = local_228._M_current;
                local_1a8 = local_238;
                uStack_1a4 = uStack_234;
                uStack_1a0 = uStack_230;
                uStack_19c = uStack_22c;
                uStack_1b0 = uStack_240;
                uStack_1ac = uStack_23c;
                local_190[0] = local_180;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)local_190,local_220._M_p,local_220._M_p + local_218);
                while ((char *)local_2d8._32_8_ != local_198) {
                  operator/=(__return_storage_ptr__,&local_2b0);
                  iterator::operator++((iterator *)local_2d8);
                }
                if (local_190[0] != local_180) {
                  operator_delete(local_190[0],local_180[0] + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_2b0._path._M_dataplus._M_p != paVar1) {
                  operator_delete(local_2b0._path._M_dataplus._M_p,
                                  local_2b0._path.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_220._M_p != &local_210) {
                  operator_delete(local_220._M_p,local_210._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_268._M_p != &local_258) {
                  operator_delete(local_268._M_p,local_258._M_allocated_capacity + 1);
                }
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_108._current._path._M_dataplus._M_p != &local_108._current._path.field_2) {
              operator_delete(local_108._current._path._M_dataplus._M_p,
                              local_108._current._path.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_148._path._M_dataplus._M_p == &local_148._path.field_2) {
              return __return_storage_ptr__;
            }
            operator_delete(local_148._path._M_dataplus._M_p,
                            local_148._path.field_2._M_allocated_capacity + 1);
            return __return_storage_ptr__;
          }
          iterator::operator++((iterator *)local_170);
          iterator::operator++(&local_108);
        } while( true );
      }
      sVar7 = root_name_length(base);
      if (sVar7 < (base->_path)._M_string_length) {
        bVar9 = (base->_path)._M_dataplus._M_p[sVar7] == '/';
      }
      else {
        bVar9 = false;
      }
      if ((undefined1 *)local_170._0_8_ != local_170 + 0x10) {
        operator_delete((void *)local_170._0_8_,local_170._16_8_ + 1);
      }
      if ((undefined1 *)local_290._0_8_ != local_290 + 0x10) {
        operator_delete((void *)local_290._0_8_,CONCAT44(local_290._20_4_,local_290._16_4_) + 1);
      }
      if (!bVar9) goto LAB_001d6c34;
      goto LAB_001d6b52;
    }
  }
  if ((undefined1 *)local_170._0_8_ != local_170 + 0x10) {
    operator_delete((void *)local_170._0_8_,local_170._16_8_ + 1);
  }
  if ((undefined1 *)local_290._0_8_ != local_290 + 0x10) {
    operator_delete((void *)local_290._0_8_,CONCAT44(local_290._20_4_,local_290._16_4_) + 1);
  }
LAB_001d6b52:
  (__return_storage_ptr__->_path)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->_path).field_2;
  (__return_storage_ptr__->_path)._M_string_length = 0;
  (__return_storage_ptr__->_path).field_2._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

GHC_INLINE path path::lexically_relative(const path& base) const
{
    if (root_name() != base.root_name() || is_absolute() != base.is_absolute() || (!has_root_directory() && base.has_root_directory())) {
        return path();
    }
    const_iterator a = begin(), b = base.begin();
    while (a != end() && b != base.end() && *a == *b) {
        ++a;
        ++b;
    }
    if (a == end() && b == base.end()) {
        return path(".");
    }
    int count = 0;
    for (const auto& element : input_iterator_range<const_iterator>(b, base.end())) {
        if (element != "." && element != "" && element != "..") {
            ++count;
        }
        else if (element == "..") {
            --count;
        }
    }
    if (count < 0) {
        return path();
    }
    path result;
    for (int i = 0; i < count; ++i) {
        result /= "..";
    }
    for (const auto& element : input_iterator_range<const_iterator>(a, end())) {
        result /= element;
    }
    return result;
}